

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintHelpOneProperty(cmDocumentation *this,ostream *os)

{
  undefined8 os_00;
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_60;
  undefined1 local_40 [8];
  string pname;
  ostream *os_local;
  cmDocumentation *this_local;
  
  pname.field_2._8_8_ = os;
  std::__cxx11::string::string((string *)&local_60,(string *)&this->CurrentArgument);
  cmSystemTools::HelpFileName((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  os_00 = pname.field_2._8_8_;
  std::operator+(&local_90,"prop_*/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  bVar1 = PrintFiles(this,(ostream *)os_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)pname.field_2._8_8_,"Argument \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->CurrentArgument);
    poVar2 = std::operator<<(poVar2,"\" to --help-property is not a CMake property.  ");
    std::operator<<(poVar2,"Use --help-property-list to see all properties.\n");
  }
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOneProperty(std::ostream& os)
{
  std::string pname = cmSystemTools::HelpFileName(this->CurrentArgument);
  if (this->PrintFiles(os, "prop_*/" + pname)) {
    return true;
  }
  // Argument was not a property.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-property is not a CMake property.  "
     << "Use --help-property-list to see all properties.\n";
  return false;
}